

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::eliminate_flatten_after_global_pooling(NetOptimize *this)

{
  int iVar1;
  value_type pLVar2;
  value_type pLVar3;
  bool bVar4;
  size_type sVar5;
  reference ppLVar6;
  reference pvVar7;
  size_type sVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  reference pvVar11;
  long in_RDI;
  int top_blob_index_final;
  Flatten *flatten;
  size_t j;
  int top_blob_index;
  Pooling *pooling;
  size_t i;
  size_t layer_count;
  char *in_stack_ffffffffffffff98;
  FILE *in_stack_ffffffffffffffa0;
  size_type local_30;
  size_type local_18;
  
  sVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58));
  local_18 = 0;
  do {
    if (sVar5 <= local_18) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_18);
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (!bVar4) {
      ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                            (in_RDI + 0x58),local_18);
      pLVar2 = *ppLVar6;
      if (*(int *)((long)&pLVar2[1].userdata + 4) != 0) {
        ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_18);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar6)->tops,0);
        iVar1 = *pvVar7;
        local_30 = local_18;
        do {
          do {
            do {
              local_30 = local_30 + 1;
              if (sVar5 <= local_30) goto LAB_00187e2a;
              std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                         local_30);
              bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
            } while (bVar4);
            ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                  (in_RDI + 0x58),local_30);
            sVar8 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar6)->bottoms);
          } while (sVar8 != 1);
          ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_30);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar6)->bottoms,0);
        } while (*pvVar7 != iVar1);
LAB_00187e2a:
        if (local_30 != sVar5) {
          ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_30);
          pLVar3 = *ppLVar6;
          in_stack_ffffffffffffffa0 = _stderr;
          uVar9 = std::__cxx11::string::c_str();
          uVar10 = std::__cxx11::string::c_str();
          fprintf(in_stack_ffffffffffffffa0,"eliminate_flatten_after_global_pooling %s %s\n",uVar9,
                  uVar10);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar3->tops,0);
          iVar1 = *pvVar7;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar2->tops,0);
          *pvVar7 = iVar1;
          pvVar11 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                              (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)(in_RDI + 0x50),
                               (long)iVar1);
          pvVar11->producer = (int)local_18;
          std::__cxx11::string::operator=((string *)&pLVar3->type,"ncnnfused");
        }
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

int NetOptimize::eliminate_flatten_after_global_pooling()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Pooling")
            continue;

        ncnn::Pooling* pooling = (ncnn::Pooling*)layers[i];
        if (pooling->global_pooling == 0)
            continue;

        // Pooling - Flatten
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Flatten")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::Flatten* flatten = (ncnn::Flatten*)layers[j];

        fprintf(stderr, "eliminate_flatten_after_global_pooling %s %s\n", pooling->name.c_str(), flatten->name.c_str());

        int top_blob_index_final = flatten->tops[0];
        pooling->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        flatten->type = "ncnnfused";
    }

    return 0;
}